

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  pointer pcVar1;
  long lVar2;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  if (this->ReportPath == 0) {
    lVar2 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x542ec2,0xffffffffffffffff);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SymbolProperties::GetFileName(const kwsys_stl::string &path) const
{
  kwsys_stl::string file(path);
  if (!this->ReportPath)
    {
    size_t at = file.rfind("/");
    if (at!=kwsys_stl::string::npos)
      {
      file = file.substr(at+1,kwsys_stl::string::npos);
      }
    }
  return file;
}